

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall Graph<Node>::royFloyd(Graph<Node> *this)

{
  int *piVar1;
  vector<int> *pvVar2;
  vector<int> *pvVar3;
  bool bVar4;
  uint uVar5;
  int *piVar6;
  size_t __size;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar7;
  size_t extraout_RDX_01;
  vector<int> *pvVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  vector<vector<int>_> *this_00;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  vector<vector<vector<int>_>_> dp;
  vector<vector<vector<int>_>_> local_40;
  
  vector<vector<vector<int>_>_>::vector(&local_40);
  local_40._size = this->_nodeCnt;
  uVar5 = 1;
  do {
    pvVar12 = (void *)(ulong)uVar5;
    bVar4 = (int)uVar5 < local_40._size;
    uVar5 = uVar5 * 2;
  } while (bVar4);
  vector<vector<vector<int>_>_>::realloc(&local_40,pvVar12,__size);
  uVar19 = (ulong)(uint)this->_nodeCnt;
  if (0 < this->_nodeCnt) {
    lVar16 = 0;
    sVar7 = extraout_RDX;
    do {
      uVar5 = 1;
      do {
        pvVar12 = (void *)(ulong)uVar5;
        bVar4 = (int)uVar5 < (int)uVar19;
        uVar5 = uVar5 * 2;
      } while (bVar4);
      this_00 = local_40.vect + lVar16;
      vector<vector<int>_>::realloc(this_00,pvVar12,sVar7);
      this_00->_size = (int)uVar19;
      uVar20 = (ulong)this->_nodeCnt;
      sVar7 = extraout_RDX_00;
      uVar19 = uVar20;
      if (0 < (long)uVar20) {
        lVar11 = 0;
        do {
          pvVar8 = local_40.vect[lVar16].vect;
          uVar5 = 1;
          do {
            pvVar12 = (void *)(ulong)uVar5;
            bVar4 = (int)uVar5 < (int)uVar19;
            uVar5 = uVar5 * 2;
          } while (bVar4);
          vector<int>::realloc(pvVar8 + lVar11,pvVar12,sVar7);
          pvVar8[lVar11]._size = (int)uVar19;
          lVar11 = lVar11 + 1;
          uVar19 = (ulong)(uint)this->_nodeCnt;
          uVar20 = (ulong)this->_nodeCnt;
          sVar7 = extraout_RDX_01;
        } while (lVar11 < (long)uVar20);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (long)uVar20);
    if (0 < (int)uVar19) {
      lVar16 = 0;
      do {
        if ((int)uVar19 < 1) {
          lVar11 = (long)(int)uVar19;
        }
        else {
          pvVar8 = local_40.vect[lVar16].vect;
          lVar13 = 0;
          do {
            iVar14 = 0x3f3f3f3f;
            if (lVar16 == lVar13) {
              iVar14 = 0;
            }
            *pvVar8->vect = iVar14;
            lVar13 = lVar13 + 1;
            uVar19 = (ulong)(uint)this->_nodeCnt;
            lVar11 = (long)this->_nodeCnt;
            pvVar8 = pvVar8 + 1;
          } while (lVar13 < lVar11);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < lVar11);
    }
  }
  if (0 < (this->edges)._size) {
    pvVar8 = (this->nextNodeInPath).vect;
    piVar6 = &((this->edges).vect)->_cost;
    lVar16 = 0;
    do {
      iVar14 = ((Edge *)(piVar6 + -2))->_nodeS;
      iVar10 = piVar6[-1];
      iVar15 = *piVar6;
      piVar1 = local_40.vect[iVar14].vect[iVar10].vect;
      iVar9 = *piVar1;
      if (iVar15 <= iVar9) {
        iVar9 = iVar15;
      }
      *piVar1 = iVar9;
      piVar1 = local_40.vect[iVar10].vect[iVar14].vect;
      iVar9 = *piVar1;
      if (iVar9 < iVar15) {
        iVar15 = iVar9;
      }
      *piVar1 = iVar15;
      pvVar8[iVar14].vect[iVar10] = iVar10;
      pvVar8[iVar10].vect[iVar14] = iVar14;
      lVar16 = lVar16 + 1;
      piVar6 = piVar6 + 3;
    } while (lVar16 < (this->edges)._size);
    uVar19 = (ulong)(uint)this->_nodeCnt;
  }
  if (0 < (int)uVar19) {
    lVar16 = 1;
    do {
      if (0 < (int)uVar19) {
        lVar11 = 0;
        do {
          if ((int)uVar19 < 1) {
            lVar13 = (long)(int)uVar19;
          }
          else {
            pvVar8 = local_40.vect[lVar11].vect;
            piVar6 = pvVar8[lVar16 + -1].vect;
            pvVar2 = local_40.vect[lVar16 + -1].vect;
            pvVar3 = (this->nextNodeInPath).vect;
            lVar18 = 0;
            lVar17 = 0;
            do {
              iVar10 = *(int *)(*(long *)((long)&pvVar2->vect + lVar18 * 4) + -4 + lVar16 * 4) +
                       piVar6[lVar16 + -1];
              lVar13 = *(long *)((long)&pvVar8->vect + lVar18 * 4);
              iVar14 = *(int *)(lVar13 + -4 + lVar16 * 4);
              if (iVar10 < iVar14) {
                *(int *)(lVar13 + lVar16 * 4) = iVar10;
                piVar1 = pvVar3[lVar11].vect;
                *(int *)((long)piVar1 + lVar18) = piVar1[lVar16 + -1];
              }
              else {
                *(int *)(lVar13 + lVar16 * 4) = iVar14;
              }
              lVar17 = lVar17 + 1;
              uVar19 = (ulong)(uint)this->_nodeCnt;
              lVar13 = (long)this->_nodeCnt;
              lVar18 = lVar18 + 4;
            } while (lVar17 < lVar13);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < lVar13);
      }
      bVar4 = lVar16 < (int)uVar19;
      lVar16 = lVar16 + 1;
    } while (bVar4);
    if (0 < (int)uVar19) {
      lVar16 = 0;
      do {
        if ((int)uVar19 < 1) {
          lVar11 = (long)(int)uVar19;
        }
        else {
          pvVar8 = local_40.vect[lVar16].vect;
          piVar6 = (this->minDist).vect[lVar16].vect;
          lVar13 = 0;
          do {
            iVar14 = pvVar8->vect[(int)uVar19];
            if (iVar14 == 0x3f3f3f3f) {
              iVar14 = -1;
            }
            piVar6[lVar13] = iVar14;
            lVar13 = lVar13 + 1;
            uVar19 = (ulong)(uint)this->_nodeCnt;
            lVar11 = (long)this->_nodeCnt;
            pvVar8 = pvVar8 + 1;
          } while (lVar13 < lVar11);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < lVar11);
    }
  }
  vector<vector<vector<int>_>_>::~vector(&local_40);
  return;
}

Assistant:

void royFloyd() {
        const int Inf = 0x3f3f3f3f;

        //make dp
        vector<vector<vector<int>>> dp;
        dp.resize(_nodeCnt);
        for (int i = 0; i < _nodeCnt; ++i) {
            dp[i].resize(_nodeCnt);
            for (int j = 0; j < _nodeCnt; ++j) {
                dp[i][j].resize(_nodeCnt);
            }
        }

        //initialize dp
        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                if (i == j) {
                    dp[i][j][0] = 0;
                }
                else {
                    dp[i][j][0] = Inf;
                }
            }
        }

        for (int i = 0; i < edges.size(); ++i) {
            Edge currEdge = getEdge(i);
            int source = currEdge.getSource();
            int dest = currEdge.getDest();
            int cost = currEdge.getCost();

            dp[source][dest][0] = min(dp[source][dest][0], cost);
            dp[dest][source][0] = min(dp[dest][source][0], cost);

            nextNodeInPath[source][dest] = dest;
            nextNodeInPath[dest][source] = source;
        }

        //calc dp (nodes added from 0 to k - 1 (+1) ||| 0 means no nodes added)
        for (int k = 1; k <= _nodeCnt; ++k) {
            for (int i = 0; i < _nodeCnt; ++i) {
                for (int j = 0; j < _nodeCnt; ++j) {
                    int kAdded = dp[i][k - 1][k - 1] + dp[k - 1][j][k - 1];
                    int kNotAdded = dp[i][j][k - 1];
                    if (kAdded < kNotAdded) {
                        dp[i][j][k] = kAdded;
                        nextNodeInPath[i][j] = nextNodeInPath[i][k - 1];
                    }
                    else {
                        dp[i][j][k] = kNotAdded;
                    }
                }
            }
        }

        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                if (dp[i][j][_nodeCnt] == Inf) {
                    minDist[i][j] = -1;
                }
                else {
                    minDist[i][j] = dp[i][j][_nodeCnt];
                }
            }
        }
    }